

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

QStyleOptionMenuItem * __thiscall
QComboMenuDelegate::getStyleOption
          (QComboMenuDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Int IVar6;
  Int IVar7;
  int iVar8;
  int iVar9;
  QAbstractItemModel *pQVar10;
  QString *pQVar11;
  QFont *pQVar12;
  QModelIndex *in_RCX;
  long in_RDX;
  StateFlag other;
  long in_RSI;
  QStyleOptionMenuItem *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar13;
  QStyleOptionMenuItem *menuOption;
  QPalette resolvedpalette;
  QVariant fontRoleData;
  QVariant variant;
  QVariant checkState;
  QVariant value;
  QFont *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  WidgetAttribute in_stack_fffffffffffffd34;
  QWidget *in_stack_fffffffffffffd38;
  QWidget *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  undefined1 uVar14;
  QStyleOptionMenuItem *this_00;
  QFontMetrics local_228 [8];
  QByteArray local_220;
  QByteArray local_208;
  QChar local_1ea;
  undefined1 local_1e8 [24];
  QBrush local_1d0 [8];
  QPixmap local_1c8 [24];
  QIcon local_1b0;
  QIcon local_1a8;
  QColor local_1a0;
  QIcon local_190;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_188;
  undefined4 local_184;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_180;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_17c;
  Int local_178;
  Int local_174;
  QBrush local_170 [8];
  QBrush local_168 [8];
  QBrush local_160 [8];
  QFont local_158 [16];
  QFont local_148 [16];
  QFont local_138 [16];
  QFont local_128 [16];
  undefined8 local_118;
  undefined4 local_110;
  undefined2 local_10c;
  QPalette local_108;
  undefined1 local_f8 [16];
  anon_union_24_3_e3d07ef4_for_data local_e8;
  undefined1 *local_d0;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined1 *puStack_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *local_30;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  memset(in_RDI,0xaa,0x98);
  QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)0x52f727);
  local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::palette((char *)in_stack_fffffffffffffd38);
  QPalette::resolve((QPalette *)local_f8);
  QPalette::~QPalette(&local_108);
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QModelIndex *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                    (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  bVar4 = ::QVariant::canConvert<QBrush>
                    ((QVariant *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  if (bVar4) {
    qvariant_cast<QBrush>((QVariant *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48))
    ;
    QPalette::setBrush((QPalette *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (ColorRole)((ulong)in_stack_fffffffffffffd28 >> 0x20),(QBrush *)0x52f829);
    QBrush::~QBrush(local_160);
    qvariant_cast<QBrush>((QVariant *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48))
    ;
    QPalette::setBrush((QPalette *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (ColorRole)((ulong)in_stack_fffffffffffffd28 >> 0x20),(QBrush *)0x52f865);
    QBrush::~QBrush(local_168);
    qvariant_cast<QBrush>((QVariant *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48))
    ;
    QPalette::setBrush((QPalette *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (ColorRole)((ulong)in_stack_fffffffffffffd28 >> 0x20),(QBrush *)0x52f8a1);
    QBrush::~QBrush(local_170);
  }
  QPalette::operator=(&(in_RDI->super_QStyleOption).palette,(QPalette *)local_f8);
  QFlags<QStyle::StateFlag>::QFlags
            ((QFlags<QStyle::StateFlag> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             (StateFlag)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  (in_RDI->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = local_174;
  QWidget::window(in_stack_fffffffffffffd40);
  bVar4 = QWidget::isActiveWindow((QWidget *)this_00);
  if (bVar4) {
    QFlags<QStyle::StateFlag>::QFlags
              ((QFlags<QStyle::StateFlag> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (StateFlag)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    (in_RDI->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i = local_178;
  }
  local_17c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                  (StateFlag)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_17c);
  bVar4 = false;
  if (IVar6 != 0) {
    pQVar10 = QModelIndex::model((QModelIndex *)0x52f963);
    local_184 = (**(code **)(*(long *)pQVar10 + 0x138))(pQVar10,in_RCX);
    local_180.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)
                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                    (ItemFlag)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_180);
    bVar4 = IVar7 != 0;
  }
  if (bVar4) {
    QFlags<QStyle::StateFlag>::operator|=(&(in_RDI->super_QStyleOption).state,State_Enabled);
  }
  else {
    QPalette::setCurrentColorGroup(&(in_RDI->super_QStyleOption).palette,Disabled);
  }
  local_188.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                  (StateFlag)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_188);
  if (IVar6 != 0) {
    QFlags<QStyle::StateFlag>::operator|=(&(in_RDI->super_QStyleOption).state,State_Selected);
  }
  in_RDI->checkType = NonExclusive;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QModelIndex *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                    (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  bVar4 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  if (bVar4) {
    iVar8 = qvariant_cast<int>((QVariant *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    in_RDI->checked = iVar8 == 2;
    iVar8 = qvariant_cast<int>((QVariant *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    other = State_Off;
    if (iVar8 == 2) {
      other = State_On;
    }
    QFlags<QStyle::StateFlag>::operator|=(&(in_RDI->super_QStyleOption).state,other);
  }
  else {
    iVar8 = QComboBox::currentIndex
                      ((QComboBox *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    iVar9 = QModelIndex::row(in_RCX);
    in_RDI->checked = iVar8 == iVar9;
  }
  bVar4 = QComboBoxDelegate::isSeparator((QModelIndex *)in_stack_fffffffffffffd40);
  if (bVar4) {
    in_RDI->menuItemType = Separator;
  }
  else {
    in_RDI->menuItemType = Normal;
  }
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QModelIndex *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                    (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  iVar8 = ::QVariant::userType((QVariant *)0x52fb8d);
  if (iVar8 == 0x1003) {
    if ((getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap == '\0') &&
       (iVar8 = __cxa_guard_acquire(&getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)
                                     ::pixmap), iVar8 != 0)) {
      QPixmap::QPixmap((QPixmap *)
                       getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap,
                       (QSize *)(in_RDX + 0x50));
      __cxa_atexit(QPixmap::~QPixmap,
                   getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap,
                   &__dso_handle);
      __cxa_guard_release(&getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap);
    }
    local_1a0 = qvariant_cast<QColor>((QVariant *)in_stack_fffffffffffffd40);
    local_118 = local_1a0._0_8_;
    local_110 = local_1a0.ct._4_4_;
    local_10c = local_1a0.ct._8_2_;
    QPixmap::fill((QColor *)getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap);
    QIcon::QIcon(&local_1a8,
                 (QPixmap *)getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap);
    QIcon::operator=((QIcon *)in_stack_fffffffffffffd40,(QIcon *)in_stack_fffffffffffffd38);
    QIcon::~QIcon(&local_1a8);
  }
  else if (iVar8 == 0x1005) {
    qvariant_cast<QIcon>((QVariant *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    QIcon::operator=((QIcon *)in_stack_fffffffffffffd40,(QIcon *)in_stack_fffffffffffffd38);
    QIcon::~QIcon(&local_190);
  }
  else {
    qvariant_cast<QPixmap>
              ((QVariant *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    QIcon::QIcon(&local_1b0,(QPixmap *)local_1c8);
    QIcon::operator=((QIcon *)in_stack_fffffffffffffd40,(QIcon *)in_stack_fffffffffffffd38);
    QIcon::~QIcon(&local_1b0);
    QPixmap::~QPixmap(local_1c8);
  }
  QModelIndex::data((QModelIndex *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                    (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  bVar4 = ::QVariant::canConvert<QBrush>
                    ((QVariant *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  ::QVariant::~QVariant(&local_88);
  if (bVar4) {
    QModelIndex::data((QModelIndex *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                      (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
    qvariant_cast<QBrush>((QVariant *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48))
    ;
    QPalette::setBrush((int)in_RDI + 0x28,Mid,(QBrush *)0xa);
    QBrush::~QBrush(local_1d0);
    ::QVariant::~QVariant(&local_a8);
  }
  QModelIndex::data((QModelIndex *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                    (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  ::QVariant::toString();
  QChar::QChar<char16_t,_true>(&local_1ea,L'&');
  QVar13 = Qt::Literals::StringLiterals::operator____L1
                     ((char *)in_stack_fffffffffffffd38,
                      CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  pQVar11 = (QString *)
            QString::replace((QChar *)local_1e8,(QLatin1String *)(ulong)(ushort)local_1ea.ucs,
                             (CaseSensitivity)QVar13.m_size);
  QString::operator=(&in_RDI->text,pQVar11);
  QString::~QString((QString *)0x52fe8e);
  ::QVariant::~QVariant(&local_c8);
  in_RDI->reservedShortcutWidth = 0;
  iVar8 = QSize::width((QSize *)0x52febb);
  in_RDI->maxIconWidth = iVar8 + 4;
  uVar1 = *(undefined8 *)(in_RDX + 0x10);
  (in_RDI->menuRect).x1 = (Representation)(int)uVar1;
  (in_RDI->menuRect).y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDX + 0x18);
  (in_RDI->menuRect).x2 = (Representation)(int)uVar1;
  (in_RDI->menuRect).y2 = (Representation)(int)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDX + 0x10);
  (in_RDI->super_QStyleOption).rect.x1 = (Representation)(int)uVar1;
  (in_RDI->super_QStyleOption).rect.y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDX + 0x18);
  (in_RDI->super_QStyleOption).rect.x2 = (Representation)(int)uVar1;
  (in_RDI->super_QStyleOption).rect.y2 = (Representation)(int)((ulong)uVar1 >> 0x20);
  local_e8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QModelIndex *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                    (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  bVar4 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  if (bVar4) {
    qvariant_cast<QFont>((QVariant *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    QFont::operator=((QFont *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     in_stack_fffffffffffffd28);
    QFont::~QFont(local_128);
  }
  else {
    bVar5 = QWidget::testAttribute(in_stack_fffffffffffffd38,in_stack_fffffffffffffd34);
    bVar3 = false;
    bVar2 = false;
    bVar4 = false;
    uVar14 = 1;
    if (!bVar5) {
      bVar5 = QWidget::testAttribute(in_stack_fffffffffffffd38,in_stack_fffffffffffffd34);
      uVar14 = 1;
      if (!bVar5) {
        bVar5 = QWidget::testAttribute(in_stack_fffffffffffffd38,in_stack_fffffffffffffd34);
        uVar14 = 1;
        if (!bVar5) {
          in_stack_fffffffffffffd40 = (QWidget *)QWidget::font(*(QWidget **)(in_RSI + 0x10));
          in_stack_fffffffffffffd38 = (QWidget *)qt_app_fonts_hash();
          QByteArray::QByteArray(&local_208,"QComboBox",-1);
          bVar3 = true;
          QFont::QFont(local_148);
          bVar2 = true;
          QHash<QByteArray,_QFont>::value
                    ((QHash<QByteArray,_QFont> *)CONCAT17(uVar14,in_stack_fffffffffffffd48),
                     (QByteArray *)in_stack_fffffffffffffd40,(QFont *)in_stack_fffffffffffffd38);
          bVar4 = true;
          uVar14 = QFont::operator!=((QFont *)in_stack_fffffffffffffd40,local_138);
        }
      }
    }
    in_stack_fffffffffffffd34 = CONCAT13(uVar14,(int3)in_stack_fffffffffffffd34);
    if (bVar4) {
      QFont::~QFont(local_138);
    }
    if (bVar2) {
      QFont::~QFont(local_148);
    }
    if (bVar3) {
      QByteArray::~QByteArray((QByteArray *)0x5300f5);
    }
    if ((in_stack_fffffffffffffd34 & 0x1000000) == WA_Disabled) {
      in_stack_fffffffffffffd28 = (QFont *)qt_app_fonts_hash();
      QByteArray::QByteArray(&local_220,"QComboMenuItem",-1);
      QWidget::font(*(QWidget **)(in_RSI + 0x10));
      QHash<QByteArray,_QFont>::value
                ((QHash<QByteArray,_QFont> *)CONCAT17(uVar14,in_stack_fffffffffffffd48),
                 (QByteArray *)in_stack_fffffffffffffd40,(QFont *)in_stack_fffffffffffffd38);
      QFont::operator=((QFont *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       in_stack_fffffffffffffd28);
      QFont::~QFont(local_158);
      QByteArray::~QByteArray((QByteArray *)0x5301a7);
    }
    else {
      pQVar12 = QWidget::font(*(QWidget **)(in_RSI + 0x10));
      QFont::operator=(&in_RDI->font,pQVar12);
    }
  }
  QFontMetrics::QFontMetrics(local_228,&in_RDI->font);
  QFontMetrics::operator=
            ((QFontMetrics *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             (QFontMetrics *)in_stack_fffffffffffffd28);
  QFontMetrics::~QFontMetrics(local_228);
  ::QVariant::~QVariant((QVariant *)&local_e8);
  ::QVariant::~QVariant((QVariant *)&local_68);
  ::QVariant::~QVariant((QVariant *)&local_48);
  ::QVariant::~QVariant((QVariant *)&local_28);
  QPalette::~QPalette((QPalette *)local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QStyleOptionMenuItem QComboMenuDelegate::getStyleOption(const QStyleOptionViewItem &option,
                                                        const QModelIndex &index) const
{
    QStyleOptionMenuItem menuOption;

    QPalette resolvedpalette = option.palette.resolve(QApplication::palette("QMenu"));
    QVariant value = index.data(Qt::ForegroundRole);
    if (value.canConvert<QBrush>()) {
        resolvedpalette.setBrush(QPalette::WindowText, qvariant_cast<QBrush>(value));
        resolvedpalette.setBrush(QPalette::ButtonText, qvariant_cast<QBrush>(value));
        resolvedpalette.setBrush(QPalette::Text, qvariant_cast<QBrush>(value));
    }
    menuOption.palette = resolvedpalette;
    menuOption.state = QStyle::State_None;
    if (mCombo->window()->isActiveWindow())
        menuOption.state = QStyle::State_Active;
    if ((option.state & QStyle::State_Enabled) && (index.model()->flags(index) & Qt::ItemIsEnabled))
        menuOption.state |= QStyle::State_Enabled;
    else
        menuOption.palette.setCurrentColorGroup(QPalette::Disabled);
    if (option.state & QStyle::State_Selected)
        menuOption.state |= QStyle::State_Selected;
    menuOption.checkType = QStyleOptionMenuItem::NonExclusive;
    // a valid checkstate means that the model has checkable items
    const QVariant checkState = index.data(Qt::CheckStateRole);
    if (!checkState.isValid()) {
        menuOption.checked = mCombo->currentIndex() == index.row();
    } else {
        menuOption.checked = qvariant_cast<int>(checkState) == Qt::Checked;
        menuOption.state |= qvariant_cast<int>(checkState) == Qt::Checked
                          ? QStyle::State_On : QStyle::State_Off;
    }
    if (QComboBoxDelegate::isSeparator(index))
        menuOption.menuItemType = QStyleOptionMenuItem::Separator;
    else
        menuOption.menuItemType = QStyleOptionMenuItem::Normal;

    const QVariant variant = index.data(Qt::DecorationRole);
    switch (variant.userType()) {
    case QMetaType::QIcon:
        menuOption.icon = qvariant_cast<QIcon>(variant);
        break;
    case QMetaType::QColor: {
        static QPixmap pixmap(option.decorationSize);
        pixmap.fill(qvariant_cast<QColor>(variant));
        menuOption.icon = pixmap;
        break; }
    default:
        menuOption.icon = qvariant_cast<QPixmap>(variant);
        break;
    }
    if (index.data(Qt::BackgroundRole).canConvert<QBrush>()) {
        menuOption.palette.setBrush(QPalette::All, QPalette::Window,
                                    qvariant_cast<QBrush>(index.data(Qt::BackgroundRole)));
    }
    menuOption.text = index.data(Qt::DisplayRole).toString().replace(u'&', "&&"_L1);
    menuOption.reservedShortcutWidth = 0;
    menuOption.maxIconWidth =  option.decorationSize.width() + 4;
    menuOption.menuRect = option.rect;
    menuOption.rect = option.rect;

    // Make sure fonts set on the model or on the combo box, in
    // that order, also override the font for the popup menu.
    QVariant fontRoleData = index.data(Qt::FontRole);
    if (fontRoleData.isValid()) {
        menuOption.font = qvariant_cast<QFont>(fontRoleData);
    } else if (mCombo->testAttribute(Qt::WA_SetFont)
            || mCombo->testAttribute(Qt::WA_MacSmallSize)
            || mCombo->testAttribute(Qt::WA_MacMiniSize)
            || mCombo->font() != qt_app_fonts_hash()->value("QComboBox", QFont())) {
        menuOption.font = mCombo->font();
    } else {
        menuOption.font = qt_app_fonts_hash()->value("QComboMenuItem", mCombo->font());
    }

    menuOption.fontMetrics = QFontMetrics(menuOption.font);

    return menuOption;
}